

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback_queue.cpp
# Opt level: O3

void __thiscall miniros::CallbackQueue::disable(CallbackQueue *this)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar1 == 0) {
    this->enabled_ = false;
    std::condition_variable::notify_all();
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void CallbackQueue::disable()
{
  std::scoped_lock<std::mutex> lock(mutex_);
  enabled_ = false;

  condition_.notify_all();
}